

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.h
# Opt level: O3

void __thiscall testing::internal::FilePath::FilePath(FilePath *this,string *pathname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  paVar1 = &(this->pathname_).field_2;
  (this->pathname_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (pathname->_M_dataplus)._M_p;
  paVar2 = &pathname->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&pathname->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->pathname_).field_2 + 8) = uVar4;
  }
  else {
    (this->pathname_)._M_dataplus._M_p = pcVar3;
    (this->pathname_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->pathname_)._M_string_length = pathname->_M_string_length;
  (pathname->_M_dataplus)._M_p = (pointer)paVar2;
  pathname->_M_string_length = 0;
  (pathname->field_2)._M_local_buf[0] = '\0';
  Normalize(this);
  return;
}

Assistant:

explicit FilePath(std::string pathname) : pathname_(std::move(pathname)) {
    Normalize();
  }